

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outsubfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  ulong uVar4;
  bool bVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  long lVar9;
  tetgenbehavior *ptVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  point pp [3];
  char facefilename [1024];
  uint local_494;
  uint local_490;
  uint local_48c;
  FILE *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long local_468 [4];
  int *local_448;
  int *local_440;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  local_468[0] = 0;
  local_468[1] = 0;
  local_468[2] = 0;
  ptVar10 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,ptVar10->outfilename);
    sVar7 = strlen(local_438);
    builtin_strncpy(local_438 + sVar7,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar7) = 0x65;
    if (ptVar10->quiet == 0) {
      printf("Writing %s.\n",local_438);
    }
    local_488 = fopen(local_438,"w");
    if (local_488 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puts("A self-intersection was detected. Program stopped.");
      puts("Hint: use -d option to detect all self-intersections.");
      exit(3);
    }
    local_448 = (int *)0x0;
    fprintf(local_488,"%ld  %d\n",this->subfaces->items,(ulong)(this->b->nobound == 0));
    ptVar10 = this->b;
    local_440 = (int *)0x0;
  }
  else {
    if (ptVar10->quiet == 0) {
      puts("Writing faces.");
      ptVar10 = this->b;
    }
    pmVar2 = this->subfaces;
    local_440 = (int *)operator_new__(-(ulong)((ulong)(pmVar2->items * 3) >> 0x3e != 0) |
                                      pmVar2->items * 0xc);
    out->trifacelist = local_440;
    if (ptVar10->order == 2) {
      uVar15 = 0xffffffffffffffff;
      if ((ulong)(pmVar2->items * 3) < 0x4000000000000000) {
        uVar15 = pmVar2->items * 0xc;
      }
      piVar6 = (int *)operator_new__(uVar15);
      out->o2facelist = piVar6;
    }
    if (ptVar10->nobound == 0) {
      uVar15 = 0xffffffffffffffff;
      if ((ulong)pmVar2->items < 0x4000000000000000) {
        uVar15 = pmVar2->items * 4;
      }
      piVar6 = (int *)operator_new__(uVar15);
      out->trifacemarkerlist = piVar6;
    }
    if (1 < ptVar10->neighout) {
      piVar6 = (int *)operator_new__(-(ulong)((pmVar2->items & 0x6000000000000000U) != 0) |
                                     pmVar2->items << 3);
      out->face2tetlist = piVar6;
    }
    out->numberoftrifaces = (int)pmVar2->items;
    local_448 = out->trifacemarkerlist;
    local_488 = (FILE *)0x0;
  }
  pmVar2 = this->subfaces;
  uVar1 = this->in->firstnumber;
  uVar18 = 0;
  if (ptVar10->zeroindex == 0) {
    uVar18 = uVar1;
  }
  bVar5 = uVar18 == 0;
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  do {
    pvVar8 = memorypool::traverse(pmVar2);
    if (pvVar8 == (void *)0x0) {
LAB_0014e7d6:
      if (out == (tetgenio *)0x0) {
        fprintf(local_488,"# Generated by %s\n",this->b->commandline);
        fclose(local_488);
      }
      return;
    }
  } while (*(long *)((long)pvVar8 + 0x18) == 0);
  local_478 = 0;
  local_490 = 0;
  local_494 = 0;
  local_48c = 0;
  local_474 = 0;
  local_47c = 0;
  iVar17 = 0;
  do {
    uVar15 = *(ulong *)((long)pvVar8 + 0x48) & 0xfffffffffffffff0;
    if (uVar15 == 0) {
LAB_0014e543:
      lVar13 = *(long *)((long)pvVar8 + (long)sorgpivot[0] * 8);
      lVar14 = *(long *)((long)pvVar8 + (long)sdestpivot[0] * 8);
      lVar12 = *(long *)((long)pvVar8 + (long)sapexpivot[0] * 8);
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        local_468[0] = lVar13;
        local_468[1] = lVar14;
        local_468[2] = lVar12;
      }
    }
    else {
      uVar11 = stpivottbl[(uint)*(ulong *)((long)pvVar8 + 0x48) & 0xf][0];
      if (*(point *)(uVar15 + 0x38) == this->dummypoint) {
        uVar4 = *(ulong *)(uVar15 + (ulong)(uVar11 & 3) * 8);
        uVar15 = uVar4 & 0xfffffffffffffff0;
        if (uVar15 == 0) goto LAB_0014e543;
        uVar11 = fsymtbl[(int)uVar11][(uint)uVar4 & 0xf];
      }
      lVar13 = *(long *)(uVar15 + (long)orgpivot[(int)uVar11] * 8);
      lVar14 = *(long *)(uVar15 + (long)destpivot[(int)uVar11] * 8);
      lVar12 = *(long *)(uVar15 + (long)apexpivot[(int)uVar11] * 8);
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        lVar9 = *(long *)(uVar15 + 0x58);
        lVar16 = 0;
        do {
          local_468[lVar16] = *(long *)(lVar9 + (long)ver2edge[(int)uVar11] * 8);
          uVar11 = enexttbl[(int)uVar11];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
    }
    if (ptVar10->nobound == 0) {
      local_48c = *(uint *)((long)pvVar8 + (long)this->shmarkindex * 4);
    }
    if (1 < ptVar10->neighout) {
      uVar15 = *(ulong *)((long)pvVar8 + 0x48) & 0xfffffffffffffff0;
      if (uVar15 == 0) {
        local_494 = 0xffffffff;
        local_490 = 0xffffffff;
      }
      else {
        local_490 = 0xffffffff;
        local_494 = 0xffffffff;
        if (*(point *)(uVar15 + 0x38) != this->dummypoint) {
          local_494 = *(uint *)(uVar15 + 0x50);
        }
        uVar15 = *(ulong *)(uVar15 + (ulong)(stpivottbl[(uint)*(ulong *)((long)pvVar8 + 0x48) & 0xf]
                                             [0] & 3) * 8) & 0xfffffffffffffff0;
        if (*(point *)(uVar15 + 0x38) != this->dummypoint) {
          local_490 = *(uint *)(uVar15 + 0x50);
        }
      }
    }
    lVar9 = (long)this->pointmarkindex;
    uVar19 = (uint)(uVar1 == 1 && bVar5);
    uVar11 = *(int *)(lVar13 + lVar9 * 4) - uVar19;
    if (out == (tetgenio *)0x0) {
      fprintf(local_488,"%5d   %4d  %4d  %4d",(ulong)uVar18,(ulong)uVar11,
              (ulong)(*(int *)(lVar14 + lVar9 * 4) - uVar19),
              (ulong)(*(int *)(lVar12 + lVar9 * 4) - uVar19));
      ptVar10 = this->b;
      if (ptVar10->order == 2) {
        lVar13 = (long)this->pointmarkindex;
        fprintf(local_488,"  %4d  %4d  %4d",(ulong)(*(int *)(local_468[0] + lVar13 * 4) - uVar19),
                (ulong)(*(int *)(local_468[1] + lVar13 * 4) - uVar19),
                (ulong)(*(int *)(local_468[2] + lVar13 * 4) - uVar19));
        ptVar10 = this->b;
      }
      if (ptVar10->nobound == 0) {
        fprintf(local_488,"    %d",(ulong)local_48c);
        ptVar10 = this->b;
      }
      if (1 < ptVar10->neighout) {
        fprintf(local_488,"    %5d  %5d",(ulong)local_494,(ulong)local_490);
      }
      fputc(10,local_488);
    }
    else {
      local_440[iVar17] = uVar11;
      local_440[(long)iVar17 + 1] = *(int *)(lVar14 + lVar9 * 4) - uVar19;
      local_440[(long)iVar17 + 2] = *(int *)(lVar12 + lVar9 * 4) - uVar19;
      if (ptVar10->order == 2) {
        piVar6 = out->o2facelist;
        lVar13 = (long)local_478;
        piVar6[lVar13] = *(int *)(local_468[0] + lVar9 * 4) - uVar19;
        piVar6[lVar13 + 1] = *(int *)(local_468[1] + (long)this->pointmarkindex * 4) - uVar19;
        local_478 = local_478 + 3;
        piVar6[lVar13 + 2] = *(int *)(local_468[2] + (long)this->pointmarkindex * 4) - uVar19;
      }
      if (ptVar10->nobound == 0) {
        lVar13 = (long)local_47c;
        local_47c = local_47c + 1;
        local_448[lVar13] = local_48c;
      }
      iVar17 = iVar17 + 3;
      if (1 < ptVar10->neighout) {
        piVar6 = out->face2tetlist;
        lVar13 = (long)local_474;
        piVar6[lVar13] = local_494;
        local_474 = local_474 + 2;
        piVar6[lVar13 + 1] = local_490;
      }
    }
    uVar18 = uVar18 + 1;
    pmVar2 = this->subfaces;
    do {
      pvVar8 = memorypool::traverse(pmVar2);
      if (pvVar8 == (void *)0x0) goto LAB_0014e7d6;
    } while (*(long *)((long)pvVar8 + 0x18) == 0);
  } while( true );
}

Assistant:

void tetgenmesh::outsubfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  int *elist = NULL;
  int *emlist = NULL;
  int index = 0, index1 = 0, index2 = 0;
  triface abuttingtet;
  face faceloop;
  point torg, tdest, tapex;
  int marker = 0;
  int firstindex, shift;
  int neigh1 = 0, neigh2 = 0;
  int facenumber;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11;
  int o2index = 0, i;

  int t1ver; // used by fsymself()

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 3);
    }
    // Number of subfaces.
    fprintf(outfile, "%ld  %d\n", subfaces->items, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[subfaces->items * 3];
    if (out->trifacelist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[subfaces->items * 3];
    }
    if (!b->nobound) {
      // Allocate memory for 'trifacemarkerlist'.
      out->trifacemarkerlist = new int[subfaces->items];
      if (out->trifacemarkerlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[subfaces->items * 2];
      if (out->face2tetlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = subfaces->items;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  facenumber = firstindex; // in->firstnumber;
  while (faceloop.sh != (shellface *) NULL) {
    stpivot(faceloop, abuttingtet);
    // If there is a tetrahedron containing this subface, orient it so
    //   that the normal of this face points to inside of the volume by
    //   right-hand rule.
    if (abuttingtet.tet != NULL) {
      if (ishulltet(abuttingtet)) {
        fsymself(abuttingtet);
      }
    }
    if (abuttingtet.tet != NULL) {
      torg = org(abuttingtet);
      tdest = dest(abuttingtet);
      tapex = apex(abuttingtet);
      if (b->order == 2) { // -o2
        // Get the three extra vertices on edges.
        extralist = (point *) (abuttingtet.tet[highorderindex]);
        workface = abuttingtet;
        for (i = 0; i < 3; i++) {
          pp[i] = extralist[ver2edge[workface.ver]];
          enextself(workface);
        }
      }
    } else {
      // This may happen when only a surface mesh be generated.
      torg = sorg(faceloop);
      tdest = sdest(faceloop);
      tapex = sapex(faceloop);
      if (b->order == 2) { // -o2
        // There is no extra node list available.
        pp[0] = torg;
        pp[1] = tdest;
        pp[2] = tapex;
      }
    }
    if (!b->nobound) {
      marker = shellmark(faceloop);
    }
    if (b->neighout > 1) {
      // '-nn' switch. Output adjacent tets indices.
      neigh1 = -1;
      neigh2 = -1;
      stpivot(faceloop, abuttingtet);
      if (abuttingtet.tet != NULL) {
        if (!ishulltet(abuttingtet)) {
          neigh1 = elemindex(abuttingtet.tet);
        }
        fsymself(abuttingtet);
        if (!ishulltet(abuttingtet)) {
          neigh2 = elemindex(abuttingtet.tet);
        }
      }
    }
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
              pointmark(torg) - shift, pointmark(tdest) - shift,
              pointmark(tapex) - shift);
      if (b->order == 2) { // -o2
        fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
      }
      if (!b->nobound) {
        fprintf(outfile, "    %d", marker);
      }
      if (b->neighout > 1) {
        fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
      }
      fprintf(outfile, "\n");
    } else {
      // Output three vertices of this face;
      elist[index++] = pointmark(torg) - shift;
      elist[index++] = pointmark(tdest) - shift;
      elist[index++] = pointmark(tapex) - shift;
      if (b->order == 2) { // -o2
        out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
      }
      if (!b->nobound) {
        emlist[index1++] = marker;
      }
      if (b->neighout > 1) {
        out->face2tetlist[index2++] = neigh1;
        out->face2tetlist[index2++] = neigh2;
      }
    }
    facenumber++;
    faceloop.sh = shellfacetraverse(subfaces);
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}